

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_common.c
# Opt level: O2

void nng_tls_config_free(nng_tls_config *cfg)

{
  return;
}

Assistant:

void
nng_tls_config_free(nng_tls_config *cfg)
{
	nni_mtx_lock(&cfg->lock);
	cfg->ref--;
	if (cfg->ref != 0) {
		nni_mtx_unlock(&cfg->lock);
		return;
	}
	nni_mtx_unlock(&cfg->lock);
	nni_mtx_fini(&cfg->lock);
	cfg->ops.fini((void *) (cfg + 1));
	nni_free(cfg, cfg->size);
}